

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t cpacr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  _Bool _Var1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar3 = (env->cp15).cpacr_el1;
  if ((env->features & 0x210000000) == 0x200000000) {
    _Var1 = arm_is_secure(env);
    if (!_Var1) {
      uVar2 = extract32((env->cp15).nsacr,10,1);
      if (uVar2 == 0) {
        uVar3 = uVar3 & 0xffffffffff0fffff;
      }
    }
  }
  return uVar3;
}

Assistant:

static uint64_t cpacr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    /*
     * For A-profile AArch32 EL3 (but not M-profile secure mode), if NSACR.CP10
     * is 0 then CPACR.{CP11,CP10} ignore writes and read as 0b00.
     */
    uint64_t value = env->cp15.cpacr_el1;

    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0xf << 20);
    }
    return value;
}